

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_blech32.c
# Opt level: O0

_Bool check_confidential_addr_from_addr_segwit_script(void)

{
  char *__s2;
  char *__s1;
  int iVar1;
  size_t sVar2;
  _Bool is_success;
  char *pcStack_e8;
  int ret;
  char *bech32;
  char *blech32;
  char bech32_address [91];
  uchar witness_script [34];
  undefined1 local_48 [8];
  uchar pub_key [33];
  long local_18;
  size_t written;
  
  local_18 = 0;
  bech32 = (char *)0x0;
  pcStack_e8 = (char *)0x0;
  iVar1 = wally_hex_to_bytes(elements_confidential_key,local_48,0x21,&local_18);
  if (iVar1 == 0) {
    if (local_18 == 0x21) {
      iVar1 = wally_hex_to_bytes(elements_witness_script,bech32_address + 0x58,0x22,&local_18);
      if (iVar1 == 0) {
        if (local_18 == 0x22) {
          iVar1 = wally_addr_segwit_from_bytes
                            (bech32_address + 0x58,0x22,"ert",0,&stack0xffffffffffffff18);
          if (iVar1 == 0) {
            strcpy((char *)&blech32,pcStack_e8);
            wally_free_string(pcStack_e8);
            iVar1 = strcmp((char *)&blech32,elements_script_bech32);
            if (iVar1 == 0) {
              iVar1 = wally_confidential_addr_from_addr_segwit
                                (&blech32,"ert","el",local_48,0x21,&bech32);
              __s1 = bech32;
              __s2 = elements_script_blech32;
              if (iVar1 == 0) {
                sVar2 = strlen(elements_script_blech32);
                iVar1 = strncmp(__s1,__s2,sVar2 + 1);
                wally_free_string(bech32);
                written._7_1_ = iVar1 == 0;
              }
              else {
                written._7_1_ = false;
              }
            }
            else {
              written._7_1_ = false;
            }
          }
          else {
            written._7_1_ = false;
          }
        }
        else {
          written._7_1_ = false;
        }
      }
      else {
        written._7_1_ = false;
      }
    }
    else {
      written._7_1_ = false;
    }
  }
  else {
    written._7_1_ = false;
  }
  return written._7_1_;
}

Assistant:

static bool check_confidential_addr_from_addr_segwit_script(void)
{
    size_t written = 0;
    unsigned char pub_key[EC_PUBLIC_KEY_LEN];
    unsigned char witness_script[SHA256_LEN + 2];
    char bech32_address[91];
    char *blech32 = NULL;
    char *bech32 = NULL;
    int ret;
    bool is_success = false;

    ret = wally_hex_to_bytes(elements_confidential_key,
                             pub_key, EC_PUBLIC_KEY_LEN, &written);
    if (ret != WALLY_OK)
        return false;

    if (written != EC_PUBLIC_KEY_LEN)
        return false;

    ret = wally_hex_to_bytes(elements_witness_script,
                             witness_script, SHA256_LEN + 2, &written);
    if (ret != WALLY_OK)
        return false;

    if (written != (SHA256_LEN + 2))
        return false;

    ret = wally_addr_segwit_from_bytes(witness_script, written,
                                       "ert", 0, &bech32);
    if (ret != WALLY_OK)
        return false;

    strcpy(bech32_address, bech32);
    wally_free_string(bech32);

    if (strcmp(bech32_address, elements_script_bech32) != 0)
        return false;

    ret = wally_confidential_addr_from_addr_segwit(bech32_address,
                                                   "ert", "el", pub_key, EC_PUBLIC_KEY_LEN, &blech32);
    if (ret != WALLY_OK)
        return false;

    if (strncmp(blech32, elements_script_blech32, strlen(elements_script_blech32) + 1) == 0)
        is_success = true;

    wally_free_string(blech32);
    return is_success;
}